

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setBlendMode(GLEngine *this,BlendMode newMode)

{
  PFNGLDISABLEPROC *pp_Var1;
  GLenum GVar2;
  GLenum GVar3;
  
  switch(newMode) {
  case Over:
    pp_Var1 = &glad_glEnable;
    goto LAB_00210697;
  case AlphaOver:
    (*glad_glEnable)(0xbe2);
    GVar3 = 0x303;
    GVar2 = 0x305;
    break;
  case OverNoWrite:
    (*glad_glEnable)(0xbe2);
    GVar3 = 0x303;
    GVar2 = 0;
    break;
  case Under:
    (*glad_glEnable)(0xbe2);
    GVar2 = 0x305;
    GVar3 = 1;
    goto LAB_0021072c;
  case Zero:
    (*glad_glEnable)(0xbe2);
    GVar2 = 0;
    goto LAB_0021072a;
  case WeightedAdd:
    (*glad_glEnable)(0xbe2);
    GVar3 = 1;
    GVar2 = 1;
    break;
  case Source:
    (*glad_glEnable)(0xbe2);
    GVar2 = 0x302;
LAB_0021072a:
    GVar3 = 0;
    goto LAB_0021072c;
  case Disable:
    pp_Var1 = &glad_glDisable;
LAB_00210697:
    (**pp_Var1)(0xbe2);
    GVar2 = 0x302;
    GVar3 = 0x303;
LAB_0021072c:
    (*glad_glBlendFunc)(GVar2,GVar3);
    return;
  default:
    return;
  }
  (*glad_glBlendFuncSeparate)(0x302,GVar3,GVar2,1);
  return;
}

Assistant:

void GLEngine::setBlendMode(BlendMode newMode) {
  switch (newMode) {
  case BlendMode::Over:
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    break;
  case BlendMode::AlphaOver:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE_MINUS_DST_ALPHA, GL_ONE);
    break;
  case BlendMode::OverNoWrite:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
    break;
  case BlendMode::Under:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE);
    break;
  case BlendMode::Zero:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ZERO, GL_ZERO);
    break;
  case BlendMode::WeightedAdd:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE, GL_ONE, GL_ONE);
    break;
  case BlendMode::Source:
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ZERO);
    break;
  case BlendMode::Disable:
    glDisable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); // doesn't actually matter
    break;
  }
}